

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_blitter.cpp
# Opt level: O1

void __thiscall
CapabilitiesToStateMask::CapabilitiesToStateMask
          (CapabilitiesToStateMask *this,Capabilities capabilities)

{
  (this->m_capabilities).super_QFlagsStorageHelper<QBlittable::Capability,_4>.
  super_QFlagsStorage<QBlittable::Capability>.i =
       (Int)capabilities.super_QFlagsStorageHelper<QBlittable::Capability,_4>.
            super_QFlagsStorage<QBlittable::Capability>.i;
  this->fillRectMask = 0;
  this->drawRectMask = 0;
  this->drawPixmapMask = 0;
  this->alphaFillRectMask = 0;
  this->opacityPixmapMask = 0;
  this->capabillitiesState = 0;
  if (((uint)capabilities.super_QFlagsStorageHelper<QBlittable::Capability,_4>.
             super_QFlagsStorage<QBlittable::Capability>.i & 1) != 0) {
    this->fillRectMask = 0x1100;
  }
  if (((uint)capabilities.super_QFlagsStorageHelper<QBlittable::Capability,_4>.
             super_QFlagsStorage<QBlittable::Capability>.i & 2) != 0) {
    this->drawPixmapMask = 0x1110;
  }
  if (((uint)capabilities.super_QFlagsStorageHelper<QBlittable::Capability,_4>.
             super_QFlagsStorage<QBlittable::Capability>.i & 4) != 0) {
    this->drawPixmapMask = this->drawPixmapMask & 0xfffc8ecc | 0x1110;
  }
  if (((uint)capabilities.super_QFlagsStorageHelper<QBlittable::Capability,_4>.
             super_QFlagsStorage<QBlittable::Capability>.i & 8) != 0) {
    this->drawPixmapMask = this->drawPixmapMask & 0xfffc8ecc | 0x1111;
  }
  if (((uint)capabilities.super_QFlagsStorageHelper<QBlittable::Capability,_4>.
             super_QFlagsStorage<QBlittable::Capability>.i & 0x10) != 0) {
    this->alphaFillRectMask = 0x1120;
  }
  if (((uint)capabilities.super_QFlagsStorageHelper<QBlittable::Capability,_4>.
             super_QFlagsStorage<QBlittable::Capability>.i & 0x20) != 0) {
    this->opacityPixmapMask = 0x3131;
  }
  return;
}

Assistant:

CapabilitiesToStateMask(QBlittable::Capabilities capabilities)
        : m_capabilities(capabilities)
        , fillRectMask(0)
        , drawRectMask(0)
        , drawPixmapMask(0)
        , alphaFillRectMask(0)
        , opacityPixmapMask(0)
        , capabillitiesState(0)
    {
        if (capabilities & QBlittable::SolidRectCapability)
            setFillRectMask();
        if (capabilities & QBlittable::SourcePixmapCapability)
           setSourcePixmapMask();
        if (capabilities & QBlittable::SourceOverPixmapCapability)
           setSourceOverPixmapMask();
        if (capabilities & QBlittable::SourceOverScaledPixmapCapability)
            setSourceOverScaledPixmapMask();
        if (capabilities & QBlittable::AlphaFillRectCapability)
            setAlphaFillRectMask();
        if (capabilities & QBlittable::OpacityPixmapCapability)
            setOpacityPixmapMask();
    }